

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node_locate.c
# Opt level: O1

mpt_node * mpt_node_locate(mpt_node *curr,int pos,void *ident,size_t len,int charset)

{
  mpt_identifier *id;
  mpt_node *pmVar1;
  int iVar2;
  int *piVar3;
  void *pvVar4;
  uint uVar5;
  ulong uVar6;
  
  if ((curr == (mpt_node *)0x0) || (ident == (void *)0x0 && len != 0)) {
    piVar3 = __errno_location();
    *piVar3 = 0xe;
  }
  else {
    uVar5 = 1;
    if (-1 < charset) {
      uVar5 = charset;
    }
    uVar6 = ((uint)charset >> 0x1f) + len;
    pmVar1 = curr;
    if (pos == 0) {
      do {
        curr = pmVar1;
        pmVar1 = curr->next;
      } while (curr->next != (mpt_node *)0x0);
      pos = -1;
      if (uVar5 == (curr->ident)._charset) {
        if (uVar6 == 0 && uVar5 != 0) {
          if ((curr->ident)._base == (char *)ident) {
            return curr;
          }
        }
        else {
          pvVar4 = mpt_identifier_data(&curr->ident);
          if ((uVar6 == (curr->ident)._len) &&
             ((-1 < charset || (*(char *)((long)pvVar4 + len) == '\0')))) {
            if (len == 0) {
              return curr;
            }
            iVar2 = bcmp(ident,pvVar4,len);
            if (iVar2 == 0) {
              return curr;
            }
          }
        }
      }
    }
    if (pos < 0) {
LAB_001168c4:
      do {
        do {
          curr = curr->prev;
          if (curr == (mpt_node *)0x0) {
            return (mpt_node *)0x0;
          }
        } while (uVar5 != (curr->ident)._charset);
        id = &curr->ident;
        if (uVar6 == 0 && uVar5 != 0) {
          if ((id->_len != 0) || ((curr->ident)._base != (char *)ident)) goto LAB_001168c4;
        }
        else {
          pvVar4 = mpt_identifier_data(id);
          if (((uVar6 != id->_len) || ((charset < 0 && (*(char *)((long)pvVar4 + len) != '\0')))) ||
             ((len != 0 && (iVar2 = bcmp(ident,pvVar4,len), iVar2 != 0)))) goto LAB_001168c4;
        }
        pos = pos + 1;
        if (pos == 0) {
          return curr;
        }
      } while( true );
    }
    do {
      if (uVar5 == (curr->ident)._charset) {
        if (uVar6 == 0 && uVar5 != 0) {
          if ((curr->ident)._base == (char *)ident) goto LAB_0011682a;
        }
        else {
          pvVar4 = mpt_identifier_data(&curr->ident);
          if (((uVar6 == (curr->ident)._len) &&
              ((-1 < charset || (*(char *)((long)pvVar4 + len) == '\0')))) &&
             ((len == 0 || (iVar2 = bcmp(ident,pvVar4,len), iVar2 == 0)))) {
LAB_0011682a:
            pos = pos + -1;
            if (pos == 0) {
              return curr;
            }
          }
        }
      }
      curr = curr->next;
    } while (curr != (mpt_node *)0x0);
  }
  return (mpt_node *)0x0;
}

Assistant:

extern MPT_STRUCT(node) *mpt_node_locate(const MPT_STRUCT(node) *curr, int pos, const void *ident, size_t len, int charset)
{
	const char *cid;
	size_t clen, idlen;
	
	/* no matching storage -> no matching node */
	if (!curr || (len && !ident)) {
		errno = EFAULT;
		return 0;
	}
	/* existing identifier type */
	if (charset >= 0) {
		idlen = len;
	}
	/* default identifier type */
	else {
		charset = MPT_CHARSET(UTF8);
		idlen = len + 1;
	}
	/* simple end search, check final for match */
	if (!pos) {
		while (curr->next) {
			curr = curr->next;
		}
		if (charset == curr->ident._charset) {
			if (charset && !idlen) {
				if (curr->ident._base == ident) {
					return (MPT_STRUCT(node) *) curr;
				}
			}
			else {
				cid  = mpt_identifier_data(&curr->ident);
				clen = curr->ident._len;
				if (idlen == clen
				    && (idlen == (size_t) len || !cid[len])
				    && (!len || !memcmp(ident, cid, len))) {
					return (MPT_STRUCT(node) *) curr;
				}
			}
		}
		pos = -1;
	}
	/* negative offset, start with previous */
	if (pos < 0) {
		while ((curr = curr->prev)) {
			if (charset != curr->ident._charset) {
				continue;
			}
			if (charset && !idlen) {
				if (!curr->ident._len
				    && curr->ident._base == ident
				    && !(++pos)) {
					break;
				}
				continue;
			}
			cid  = mpt_identifier_data(&curr->ident);
			clen = curr->ident._len;
			if (idlen == clen
			    && (idlen == (size_t) len || !cid[len])
			    && (!len || !memcmp(ident, cid, len))) {
				if (!(++pos)) {
					break;
				}
			}
		}
		return (MPT_STRUCT(node) *) curr;
	}
	/* positive offset, start with current */
	do {
		if (charset != curr->ident._charset) {
			continue;
		}
		if (charset && !idlen) {
			if (curr->ident._base == ident
			    && !(--pos)) {
				break;
			}
			continue;
		}
		cid  = mpt_identifier_data(&curr->ident);
		clen = curr->ident._len;
		if (idlen == clen
		    && (idlen == (size_t) len || !cid[len])
		    && (!len || !memcmp(ident, cid, len))) {
			if (!(--pos)) {
				break;
			}
		}
	} while ((curr = curr->next));
	
	return (MPT_STRUCT(node) *) curr;
}